

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall EventQueue::RemoveAgentsByReceiver(EventQueue *this,void *receiver)

{
  bool bVar1;
  Id IVar2;
  int iVar3;
  Event **ppEVar4;
  undefined4 extraout_var;
  iterator local_60;
  Event *local_58;
  EventAgent *agent;
  undefined1 local_38 [8];
  iterator i;
  AutoLock _auto_lock_;
  void *receiver_local;
  EventQueue *this_local;
  
  AutoLock::AutoLock((AutoLock *)&i,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0xa1);
  JetHead::list<Event_*>::begin((list<Event_*> *)local_38);
  while( true ) {
    JetHead::list<Event_*>::end((list<Event_*> *)&agent);
    bVar1 = JetHead::list<Event_*>::iterator::operator!=((iterator *)local_38,(iterator *)&agent);
    JetHead::list<Event_*>::iterator::~iterator((iterator *)&agent);
    if (!bVar1) break;
    ppEVar4 = JetHead::list<Event_*>::iterator::operator*((iterator *)local_38);
    IVar2 = Event::getEventId(*ppEVar4);
    if (IVar2 == -5) {
      ppEVar4 = JetHead::list<Event_*>::iterator::operator*((iterator *)local_38);
      local_58 = *ppEVar4;
      iVar3 = (*(local_58->super_RefCount)._vptr_RefCount[4])();
      if ((void *)CONCAT44(extraout_var,iVar3) == receiver) {
        ppEVar4 = JetHead::list<Event_*>::iterator::operator*((iterator *)local_38);
        RefCount::Release(&(*ppEVar4)->super_RefCount);
        JetHead::list<Event_*>::iterator::erase(&local_60);
        local_38 = (undefined1  [8])local_60.mNode;
        JetHead::list<Event_*>::iterator::~iterator(&local_60);
        JetHead::list<Event_*>::iterator::operator--((iterator *)local_38);
      }
    }
    JetHead::list<Event_*>::iterator::operator++((iterator *)local_38);
  }
  JetHead::list<Event_*>::iterator::~iterator((iterator *)local_38);
  AutoLock::~AutoLock((AutoLock *)&i);
  return;
}

Assistant:

void EventQueue::RemoveAgentsByReceiver( void* receiver )
{
	DebugAutoLock( mLock );

	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i)->getEventId() == Event::kAgentEventId)
		{
			EventAgent* agent = static_cast<EventAgent*>(*i);
			if (agent->getDeliveryTarget() == receiver)
			{
				(*i)->Release();
				i = i.erase();
				--i;
			}
		}
	}
}